

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

Privkey * cfd::core::operator-(Privkey *__return_storage_ptr__,Privkey *left,Privkey *right)

{
  undefined3 uVar1;
  NetType NVar2;
  Privkey local_38;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)left);
  uVar1 = *(undefined3 *)&left->field_0x19;
  NVar2 = left->net_type_;
  __return_storage_ptr__->is_compressed_ = left->is_compressed_;
  *(undefined3 *)&__return_storage_ptr__->field_0x19 = uVar1;
  __return_storage_ptr__->net_type_ = NVar2;
  Privkey::operator-=(&local_38,__return_storage_ptr__,right);
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey operator-(const Privkey &left, const Privkey &right) {
  Privkey key = left;
  key -= right;
  return key;
}